

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O0

RTPTime __thiscall jrtplib::RTCPScheduler::GetTransmissionDelay(RTCPScheduler *this)

{
  bool bVar1;
  int iVar2;
  RTPTime local_28;
  RTPTime curtime;
  RTCPScheduler *this_local;
  RTPTime diff;
  
  if ((this->firstcall & 1U) != 0) {
    this->firstcall = false;
    curtime = RTPTime::CurrentTime();
    (this->prevrtcptime).m_t = curtime.m_t;
    iVar2 = RTPSources::GetActiveMemberCount(this->sources);
    this->pmembers = iVar2;
    CalculateNextRTCPTime(this);
  }
  local_28 = RTPTime::CurrentTime();
  bVar1 = RTPTime::operator>(&local_28,&this->nextrtcptime);
  if (bVar1) {
    RTPTime::RTPTime((RTPTime *)&this_local,0,0);
  }
  else {
    this_local = (RTCPScheduler *)(this->nextrtcptime).m_t;
    RTPTime::operator-=((RTPTime *)&this_local,&local_28);
  }
  return (RTPTime)(double)this_local;
}

Assistant:

RTPTime RTCPScheduler::GetTransmissionDelay()
{
	if (firstcall)
	{
		firstcall = false;
		prevrtcptime = RTPTime::CurrentTime();
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
	}
	
	RTPTime curtime = RTPTime::CurrentTime();

	if (curtime > nextrtcptime) // packet should be sent
		return RTPTime(0,0);

	RTPTime diff = nextrtcptime;
	diff -= curtime;
	
	return diff;
}